

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerHLSL::emit_struct_member
          (CompilerHLSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,
          string *qualifier,uint32_t base_offset)

{
  ID *__k;
  StorageClass SVar1;
  bool bVar2;
  uint uVar3;
  SPIRType *pSVar4;
  mapped_type *pmVar5;
  CompilerError *this_00;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  ulong uVar6;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string packing_offset;
  string local_90;
  Bitset memberflags;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,base_offset);
  pSVar4 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,member_type_id);
  memberflags.lower = 0;
  memberflags.higher._M_h._M_buckets = &memberflags.higher._M_h._M_single_bucket;
  memberflags.higher._M_h._M_bucket_count = 1;
  memberflags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  memberflags.higher._M_h._M_element_count = 0;
  memberflags.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memberflags.higher._M_h._M_rehash_policy._M_next_resize = 0;
  memberflags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __k = &(type->super_IVariant).self;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  uVar6 = (ulong)index;
  if (uVar6 < (pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.buffer_size) {
    Bitset::operator=(&memberflags,
                      &(pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar6].
                       decoration_flags);
  }
  packing_offset._M_dataplus._M_p = (pointer)&packing_offset.field_2;
  packing_offset._M_string_length = 0;
  packing_offset.field_2._M_local_buf[0] = '\0';
  SVar1 = type->storage;
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,
                     SPIRVCrossDecorationExplicitOffset);
  if (bVar2 || SVar1 == StorageClassPushConstant) {
    bVar2 = Compiler::has_member_decoration((Compiler *)this,(TypeID)__k->id,index,DecorationOffset)
    ;
    if (bVar2) {
      uVar3 = (pmVar5->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[uVar6].offset -
              base_offset;
      if ((uVar3 & 3) != 0) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Cannot pack on tighter bounds than 4 bytes in HLSL.");
        __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_d0._M_dataplus._M_p._0_4_ = uVar3 >> 4;
      join<char_const(&)[16],unsigned_int,char_const*&,char_const(&)[2]>
                (&local_f0,(spirv_cross *)" : packoffset(c",(char (*) [16])&local_d0,
                 (uint *)((long)emit_struct_member::packing_swizzle + (ulong)(uVar3 & 0xc) * 2),
                 (char **)0x27e75d,ts_3);
      ::std::__cxx11::string::operator=((string *)&packing_offset,(string *)&local_f0);
      ::std::__cxx11::string::~string((string *)&local_f0);
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x35])
            (&local_f0,this,type,(ulong)index);
  CompilerGLSL::to_member_name_abi_cxx11_(&local_90,&this->super_CompilerGLSL,type,index);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
            (&local_d0,this,pSVar4,&local_90,0);
  CompilerGLSL::
  statement<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (&this->super_CompilerGLSL,&local_f0,qualifier,&local_d0,&packing_offset,
             (char (*) [2])0x297c5b);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::__cxx11::string::~string((string *)&packing_offset);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&memberflags.higher._M_h);
  return;
}

Assistant:

void CompilerHLSL::emit_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                      const string &qualifier, uint32_t base_offset)
{
	auto &membertype = get<SPIRType>(member_type_id);

	Bitset memberflags;
	auto &memb = ir.meta[type.self].members;
	if (index < memb.size())
		memberflags = memb[index].decoration_flags;

	string packing_offset;
	bool is_push_constant = type.storage == StorageClassPushConstant;

	if ((has_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset) || is_push_constant) &&
	    has_member_decoration(type.self, index, DecorationOffset))
	{
		uint32_t offset = memb[index].offset - base_offset;
		if (offset & 3)
			SPIRV_CROSS_THROW("Cannot pack on tighter bounds than 4 bytes in HLSL.");

		static const char *packing_swizzle[] = { "", ".y", ".z", ".w" };
		packing_offset = join(" : packoffset(c", offset / 16, packing_swizzle[(offset & 15) >> 2], ")");
	}

	statement(layout_for_member(type, index), qualifier,
	          variable_decl(membertype, to_member_name(type, index)), packing_offset, ";");
}